

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O2

AssertionResult *
iutest::internal::CmpHelperFloatingPointComplexEQ<double>
          (AssertionResult *__return_storage_ptr__,char *expr1,char *expr2,complex<double> *val1,
          complex<double> *val2)

{
  bool bVar1;
  complex<double> *extraout_RDX;
  complex<double> *extraout_RDX_00;
  complex<double> *v;
  complex<double> *v_00;
  floating_point<double> imag2;
  floating_point<double> imag1;
  floating_point<double> real2;
  floating_point<double> real1;
  FInt local_d0;
  FInt local_c8;
  string local_c0;
  string local_a0;
  string local_80;
  FInt local_60;
  FInt local_58;
  string local_50;
  
  local_58 = *(FInt *)val1->_M_value;
  local_60 = *(FInt *)val2->_M_value;
  local_c8 = *(FInt *)(val1->_M_value + 8);
  local_d0 = *(FInt *)(val2->_M_value + 8);
  bVar1 = floating_point<double>::AlmostEquals
                    ((floating_point<double> *)&local_58,(_Myt *)&local_60);
  v = extraout_RDX;
  if ((bVar1) &&
     (bVar1 = floating_point<double>::AlmostEquals
                        ((floating_point<double> *)&local_c8,(_Myt *)&local_d0), v = extraout_RDX_00
     , bVar1)) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
    return __return_storage_ptr__;
  }
  PrintToString<std::complex<double>>(&local_50,(iutest *)val1,v);
  detail::ShowStringQuoted(&local_80,&local_50);
  PrintToString<std::complex<double>>(&local_c0,(iutest *)val2,v_00);
  detail::ShowStringQuoted(&local_a0,&local_c0);
  EqFailure(__return_storage_ptr__,expr1,expr2,&local_80,&local_a0,false);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

inline AssertionResult CmpHelperFloatingPointComplexEQ(const char* expr1, const char* expr2
                                                , const ::std::complex<RawType>& val1, const ::std::complex<RawType>& val2)
{
    floating_point<RawType> real1(val1.real()), real2(val2.real());
    floating_point<RawType> imag1(val1.imag()), imag2(val2.imag());
    if IUTEST_COND_LIKELY( real1.AlmostEquals(real2) && imag1.AlmostEquals(imag2) )
    {
        return AssertionSuccess();
    }